

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_matcher.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
::string_matcher(string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
                 *this,string_type *str,
                regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  ctype<char> *pcVar1;
  char cVar2;
  size_type sVar3;
  size_type sVar4;
  pointer pcVar5;
  
  (this->str_)._M_dataplus._M_p = (pointer)&(this->str_).field_2;
  pcVar5 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar5,pcVar5 + str->_M_string_length);
  this->end_ = (char_type *)0x0;
  pcVar5 = (this->str_)._M_dataplus._M_p;
  sVar3 = (this->str_)._M_string_length;
  if (sVar3 == 0) {
    sVar3 = 0;
  }
  else {
    sVar4 = 0;
    do {
      pcVar1 = (tr->super_cpp_regex_traits<char>).ctype_;
      cVar2 = (**(code **)(*(long *)pcVar1 + 0x20))(pcVar1,(int)pcVar5[sVar4]);
      pcVar5[sVar4] = cVar2;
      sVar4 = sVar4 + 1;
    } while (sVar3 != sVar4);
    pcVar5 = (this->str_)._M_dataplus._M_p;
    sVar3 = (this->str_)._M_string_length;
  }
  this->end_ = pcVar5 + sVar3;
  return;
}

Assistant:

string_matcher(string_type const &str, Traits const &tr)
          : str_(str)
          , end_()
        {
            typename range_iterator<string_type>::type cur = boost::begin(this->str_);
            typename range_iterator<string_type>::type end = boost::end(this->str_);
            for(; cur != end; ++cur)
            {
                *cur = detail::translate(*cur, tr, icase_type());
            }
            this->end_ = detail::data_end(str_);
        }